

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O2

void printDB(void)

{
  ostream *poVar1;
  Person *pPVar2;
  long lVar3;
  size_t j;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Database db;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"sample.db",(allocator *)&v);
  hiberlite::Database::Database(&db,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  hiberlite::Database::registerBeanClass<Person>(&db);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x0f');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,&local_90,
                 "\nreading the DB\n");
  std::operator<<((ostream *)&std::cout,(string *)&v);
  std::__cxx11::string::~string((string *)&v);
  std::__cxx11::string::~string((string *)&local_90);
  hiberlite::Database::getAllBeans<Person>(&v,&db);
  poVar1 = std::operator<<((ostream *)&std::cout,"found ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," persons in the database:\n");
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)v.
                             super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)v.
                            super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"[name=");
    pPVar2 = hiberlite::bean_ptr<Person>::operator->
                       (v.
                        super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar4);
    poVar1 = std::operator<<(poVar1,(string *)pPVar2);
    std::operator<<(poVar1,"\t");
    std::operator<<((ostream *)&std::cout,"age=");
    pPVar2 = hiberlite::bean_ptr<Person>::operator->
                       (v.
                        super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar4);
    poVar1 = std::ostream::_M_insert<double>(pPVar2->age);
    std::operator<<(poVar1,"\t");
    std::operator<<((ostream *)&std::cout,"bio={");
    lVar3 = 0;
    uVar5 = 0;
    while( true ) {
      pPVar2 = hiberlite::bean_ptr<Person>::operator->
                         (v.
                          super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar4);
      if ((ulong)((long)(pPVar2->bio).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pPVar2->bio).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar5) break;
      if (uVar5 != 0) {
        std::operator<<((ostream *)&std::cout,", ");
      }
      pPVar2 = hiberlite::bean_ptr<Person>::operator->
                         (v.
                          super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar4);
      std::operator<<((ostream *)&std::cout,
                      (string *)
                      ((long)&(((pPVar2->bio).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar3));
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 0x20;
    }
    std::operator<<((ostream *)&std::cout,"}]\n");
  }
  std::vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>::~vector
            (&v);
  hiberlite::Database::~Database(&db);
  return;
}

Assistant:

void printDB()
{
  hiberlite::Database db("sample.db");
  db.registerBeanClass<Person>();

  cout << string(15,'=')+"\nreading the DB\n";

  vector< hiberlite::bean_ptr<Person> > v=db.getAllBeans<Person>();

  cout << "found " << v.size() << " persons in the database:\n";

  for(size_t j=0;j<v.size();j++){
    cout << "[name=" << v[j]->name << "\t";
    cout << "age=" << v[j]->age << "\t";
    cout << "bio={";
    for(size_t i=0;i<v[j]->bio.size();i++)
      i && cout << ", ", cout << v[j]->bio[i];
    cout << "}]\n";
  }
}